

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

UGroup * re2::MaybeParsePerlCCEscape(StringPiece *s,ParseFlags parse_flags)

{
  char cVar1;
  ParseFlags PVar2;
  int iVar3;
  iterator offset;
  UGroup *pUVar4;
  UGroup *g;
  StringPiece name;
  ParseFlags parse_flags_local;
  StringPiece *s_local;
  
  name._12_4_ = parse_flags;
  PVar2 = operator&(parse_flags,PerlClasses);
  if (((PVar2 != NoParseFlags) && (iVar3 = StringPiece::size(s), 1 < iVar3)) &&
     (cVar1 = StringPiece::operator[](s,0), cVar1 == '\\')) {
    offset = StringPiece::begin(s);
    StringPiece::StringPiece((StringPiece *)&g,offset,2);
    pUVar4 = LookupPerlGroup((StringPiece *)&g);
    if (pUVar4 != (UGroup *)0x0) {
      iVar3 = StringPiece::size((StringPiece *)&g);
      StringPiece::remove_prefix(s,iVar3);
      return pUVar4;
    }
    return (UGroup *)0x0;
  }
  return (UGroup *)0x0;
}

Assistant:

const UGroup* MaybeParsePerlCCEscape(StringPiece* s, Regexp::ParseFlags parse_flags) {
  if (!(parse_flags & Regexp::PerlClasses))
    return NULL;
  if (s->size() < 2 || (*s)[0] != '\\')
    return NULL;
  // Could use StringPieceToRune, but there aren't
  // any non-ASCII Perl group names.
  StringPiece name(s->begin(), 2);
  const UGroup *g = LookupPerlGroup(name);
  if (g == NULL)
    return NULL;
  s->remove_prefix(name.size());
  return g;
}